

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

bool __thiscall
brotli::HashLongestMatch<15,_7,_10>::FindLongestMatch
          (HashLongestMatch<15,_7,_10> *this,uint8_t *data,size_t ring_buffer_mask,
          int *distance_cache,size_t cur_ix,size_t max_length,size_t max_backward,
          size_t *best_len_out,size_t *best_len_code_out,size_t *best_distance_out,
          double *best_score_out)

{
  ushort uVar1;
  bool bVar2;
  uint32_t uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  size_t copy_length;
  size_t backward_reference_offset;
  double dVar8;
  bool local_125;
  uint local_124;
  double score_2;
  size_t backward_2;
  size_t word_id;
  size_t transform_id;
  size_t matchlen;
  size_t offset;
  size_t dist;
  size_t len_2;
  uint16_t v;
  ulong uStack_d0;
  int k;
  size_t dict_key;
  double score_1;
  size_t len_1;
  size_t backward_1;
  size_t prev_ix_1;
  size_t i_1;
  size_t down;
  uint32_t *bucket;
  uint32_t key;
  double score;
  size_t len;
  size_t prev_ix;
  size_t backward;
  size_t idx;
  size_t i;
  size_t best_len;
  double best_score;
  bool match_found;
  size_t cur_ix_masked;
  size_t max_length_local;
  size_t cur_ix_local;
  int *distance_cache_local;
  size_t ring_buffer_mask_local;
  uint8_t *data_local;
  HashLongestMatch<15,_7,_10> *this_local;
  
  *best_len_code_out = 0;
  uVar4 = cur_ix & ring_buffer_mask;
  bVar2 = false;
  best_len = (size_t)*best_score_out;
  i = *best_len_out;
  *best_len_out = 0;
  for (idx = 0; idx < 10; idx = idx + 1) {
    uVar5 = (ulong)(distance_cache[*(uint *)(kDistanceCacheIndex + idx * 4)] +
                   *(int *)(kDistanceCacheOffset + idx * 4));
    if (((((cur_ix - uVar5 < cur_ix) && (uVar5 <= max_backward)) &&
         (uVar6 = ring_buffer_mask & cur_ix - uVar5, uVar4 + i <= ring_buffer_mask)) &&
        (((uVar6 + i <= ring_buffer_mask && (data[uVar4 + i] == data[uVar6 + i])) &&
         ((sVar7 = FindMatchLengthWithLimit(data + uVar6,data + uVar4,max_length), 2 < sVar7 ||
          ((sVar7 == 2 && (idx < 2)))))))) &&
       (dVar8 = BackwardReferenceScoreUsingLastDistance(sVar7,idx), (double)best_len < dVar8)) {
      *best_len_out = sVar7;
      *best_len_code_out = sVar7;
      *best_distance_out = uVar5;
      *best_score_out = dVar8;
      bVar2 = true;
      i = sVar7;
      best_len = (size_t)dVar8;
    }
  }
  uVar3 = HashBytes(data + uVar4);
  if (this->num_[uVar3] < 0x81) {
    local_124 = 0;
  }
  else {
    local_124 = this->num_[uVar3] - 0x80;
  }
  prev_ix_1 = (size_t)this->num_[uVar3];
  while (local_124 < prev_ix_1) {
    prev_ix_1 = prev_ix_1 - 1;
    uVar6 = (ulong)this->buckets_[uVar3][prev_ix_1 & 0x7f];
    uVar5 = cur_ix - uVar6;
    local_125 = uVar5 == 0 || max_backward < uVar5;
    if (local_125) break;
    uVar6 = ring_buffer_mask & uVar6;
    if ((((uVar4 + i <= ring_buffer_mask) && (uVar6 + i <= ring_buffer_mask)) &&
        (data[uVar4 + i] == data[uVar6 + i])) &&
       ((sVar7 = FindMatchLengthWithLimit(data + uVar6,data + uVar4,max_length), 3 < sVar7 &&
        (dVar8 = BackwardReferenceScore(sVar7,uVar5), (double)best_len < dVar8)))) {
      *best_len_out = sVar7;
      *best_len_code_out = sVar7;
      *best_distance_out = uVar5;
      *best_score_out = dVar8;
      bVar2 = true;
      i = sVar7;
      best_len = (size_t)dVar8;
    }
  }
  this->buckets_[uVar3][this->num_[uVar3] & 0x7f] = (uint32_t)cur_ix;
  this->num_[uVar3] = this->num_[uVar3] + 1;
  if ((bVar2 == false) && (this->num_dict_lookups_ >> 7 <= this->num_dict_matches_)) {
    uVar3 = Hash<14>(data + uVar4);
    uStack_d0 = (ulong)(uVar3 << 1);
    for (len_2._4_4_ = 0; len_2._4_4_ < 2; len_2._4_4_ = len_2._4_4_ + 1) {
      this->num_dict_lookups_ = this->num_dict_lookups_ + 1;
      uVar1 = *(ushort *)(kStaticDictionaryHash + uStack_d0 * 2);
      if (uVar1 != 0) {
        sVar7 = (size_t)(int)(uVar1 & 0x1f);
        if (((sVar7 <= max_length) &&
            (copy_length = FindMatchLengthWithLimit
                                     (data + uVar4,
                                      kBrotliDictionary +
                                      (ulong)kBrotliDictionaryOffsetsByLength[sVar7] +
                                      sVar7 * (long)((int)(uint)uVar1 >> 5),sVar7),
            sVar7 < copy_length + 10)) && (copy_length != 0)) {
          backward_reference_offset =
               max_backward +
               (ulong)(byte)kCutoffTransforms[sVar7 - copy_length] * (long)(1 << (""[sVar7] & 0x1f))
               + (long)((int)(uint)uVar1 >> 5) + 1;
          dVar8 = BackwardReferenceScore(copy_length,backward_reference_offset);
          if ((double)best_len < dVar8) {
            this->num_dict_matches_ = this->num_dict_matches_ + 1;
            *best_len_out = copy_length;
            *best_len_code_out = sVar7;
            *best_distance_out = backward_reference_offset;
            *best_score_out = dVar8;
            bVar2 = true;
            best_len = (size_t)dVar8;
          }
        }
      }
      uStack_d0 = uStack_d0 + 1;
    }
  }
  return bVar2;
}

Assistant:

bool FindLongestMatch(const uint8_t * __restrict data,
                        const size_t ring_buffer_mask,
                        const int* __restrict distance_cache,
                        const size_t cur_ix,
                        const size_t max_length,
                        const size_t max_backward,
                        size_t * __restrict best_len_out,
                        size_t * __restrict best_len_code_out,
                        size_t * __restrict best_distance_out,
                        double * __restrict best_score_out) {
    *best_len_code_out = 0;
    const size_t cur_ix_masked = cur_ix & ring_buffer_mask;
    bool match_found = false;
    // Don't accept a short copy from far away.
    double best_score = *best_score_out;
    size_t best_len = *best_len_out;
    *best_len_out = 0;
    // Try last distance first.
    for (size_t i = 0; i < kNumLastDistancesToCheck; ++i) {
      const size_t idx = kDistanceCacheIndex[i];
      const size_t backward =
          static_cast<size_t>(distance_cache[idx] + kDistanceCacheOffset[i]);
      size_t prev_ix = static_cast<size_t>(cur_ix - backward);
      if (prev_ix >= cur_ix) {
        continue;
      }
      if (PREDICT_FALSE(backward > max_backward)) {
        continue;
      }
      prev_ix &= ring_buffer_mask;

      if (cur_ix_masked + best_len > ring_buffer_mask ||
          prev_ix + best_len > ring_buffer_mask ||
          data[cur_ix_masked + best_len] != data[prev_ix + best_len]) {
        continue;
      }
      const size_t len = FindMatchLengthWithLimit(&data[prev_ix],
                                                  &data[cur_ix_masked],
                                                  max_length);
      if (len >= 3 || (len == 2 && i < 2)) {
        // Comparing for >= 2 does not change the semantics, but just saves for
        // a few unnecessary binary logarithms in backward reference score,
        // since we are not interested in such short matches.
        double score = BackwardReferenceScoreUsingLastDistance(len, i);
        if (best_score < score) {
          best_score = score;
          best_len = len;
          *best_len_out = best_len;
          *best_len_code_out = best_len;
          *best_distance_out = backward;
          *best_score_out = best_score;
          match_found = true;
        }
      }
    }
    const uint32_t key = HashBytes(&data[cur_ix_masked]);
    const uint32_t * __restrict const bucket = &buckets_[key][0];
    const size_t down = (num_[key] > kBlockSize) ? (num_[key] - kBlockSize) : 0;
    for (size_t i = num_[key]; i > down;) {
      --i;
      size_t prev_ix = bucket[i & kBlockMask];
      const size_t backward = cur_ix - prev_ix;
      if (PREDICT_FALSE(backward == 0 || backward > max_backward)) {
        break;
      }
      prev_ix &= ring_buffer_mask;
      if (cur_ix_masked + best_len > ring_buffer_mask ||
          prev_ix + best_len > ring_buffer_mask ||
          data[cur_ix_masked + best_len] != data[prev_ix + best_len]) {
        continue;
      }
      const size_t len = FindMatchLengthWithLimit(&data[prev_ix],
                                                  &data[cur_ix_masked],
                                                  max_length);
      if (len >= 4) {
        // Comparing for >= 3 does not change the semantics, but just saves
        // for a few unnecessary binary logarithms in backward reference
        // score, since we are not interested in such short matches.
        double score = BackwardReferenceScore(len, backward);
        if (best_score < score) {
          best_score = score;
          best_len = len;
          *best_len_out = best_len;
          *best_len_code_out = best_len;
          *best_distance_out = backward;
          *best_score_out = best_score;
          match_found = true;
        }
      }
    }
    buckets_[key][num_[key] & kBlockMask] = static_cast<uint32_t>(cur_ix);
    ++num_[key];
    if (!match_found && num_dict_matches_ >= (num_dict_lookups_ >> 7)) {
      size_t dict_key = Hash<14>(&data[cur_ix_masked]) << 1;
      for (int k = 0; k < 2; ++k, ++dict_key) {
        ++num_dict_lookups_;
        const uint16_t v = kStaticDictionaryHash[dict_key];
        if (v > 0) {
          const size_t len = v & 31;
          const size_t dist = v >> 5;
          const size_t offset =
              kBrotliDictionaryOffsetsByLength[len] + len * dist;
          if (len <= max_length) {
            const size_t matchlen =
                FindMatchLengthWithLimit(&data[cur_ix_masked],
                                         &kBrotliDictionary[offset], len);
            if (matchlen + kCutoffTransformsCount > len && matchlen > 0) {
              const size_t transform_id = kCutoffTransforms[len - matchlen];
              const size_t word_id =
                  transform_id * (1 << kBrotliDictionarySizeBitsByLength[len]) +
                  dist;
              const size_t backward = max_backward + word_id + 1;
              double score = BackwardReferenceScore(matchlen, backward);
              if (best_score < score) {
                ++num_dict_matches_;
                best_score = score;
                best_len = matchlen;
                *best_len_out = best_len;
                *best_len_code_out = len;
                *best_distance_out = backward;
                *best_score_out = best_score;
                match_found = true;
              }
            }
          }
        }
      }
    }
    return match_found;
  }